

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IndexFreeArray(Fts5Data **ap,int n)

{
  ulong uVar1;
  
  if (ap != (Fts5Data **)0x0) {
    if (0 < n) {
      uVar1 = 0;
      do {
        sqlite3_free(ap[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
    sqlite3_free(ap);
    return;
  }
  return;
}

Assistant:

static void fts5IndexFreeArray(Fts5Data **ap, int n){
  if( ap ){
    int ii;
    for(ii=0; ii<n; ii++){
      fts5DataRelease(ap[ii]);
    }
    sqlite3_free(ap);
  }
}